

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall fmt::v9::format_int::format_signed<int>(format_int *this,int value)

{
  char *pcVar1;
  int in_ESI;
  char *begin;
  bool negative;
  uint32_or_64_or_128_t<int> abs_value;
  char *local_20;
  undefined3 in_stack_ffffffffffffffec;
  uint value_00;
  int iVar2;
  
  value_00 = CONCAT13(in_ESI < 0,in_stack_ffffffffffffffec);
  iVar2 = in_ESI;
  if (in_ESI < 0) {
    iVar2 = -in_ESI;
  }
  pcVar1 = format_unsigned<unsigned_int>((format_int *)CONCAT44(in_ESI,iVar2),value_00);
  local_20 = pcVar1;
  if ((value_00 & 0x1000000) != 0) {
    local_20 = pcVar1 + -1;
    pcVar1[-1] = '-';
  }
  return local_20;
}

Assistant:

auto format_signed(Int value) -> char* {
    auto abs_value = static_cast<detail::uint32_or_64_or_128_t<Int>>(value);
    bool negative = value < 0;
    if (negative) abs_value = 0 - abs_value;
    auto begin = format_unsigned(abs_value);
    if (negative) *--begin = '-';
    return begin;
  }